

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

string * __thiscall
Catch::Detail::convertIntoString_abi_cxx11_
          (string *__return_storage_ptr__,Detail *this,StringRef string,bool escape_invisibles)

{
  const_iterator pcVar1;
  string *psVar2;
  StringRef rhs;
  char c;
  const_iterator __end2;
  const_iterator __begin2;
  StringRef *__range2;
  undefined1 auStack_20 [7];
  bool escape_invisibles_local;
  StringRef string_local;
  string *ret;
  
  string_local.m_start = string.m_start;
  psVar2 = __return_storage_ptr__;
  _auStack_20 = (string *)this;
  string_local.m_size = (size_type)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  StringRef::size((StringRef *)auStack_20);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (((undefined1  [16])string & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\"');
    rhs.m_size = (size_type)psVar2;
    rhs.m_start = string_local.m_start;
    Catch::operator+=((Catch *)__return_storage_ptr__,_auStack_20,rhs);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\"');
  }
  else {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\"');
    __end2 = StringRef::begin((StringRef *)auStack_20);
    pcVar1 = StringRef::end((StringRef *)auStack_20);
    for (; __end2 != pcVar1; __end2 = __end2 + 1) {
      switch(*__end2) {
      case '\t':
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        break;
      case '\n':
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        break;
      default:
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        break;
      case '\f':
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        break;
      case '\r':
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\"');
  }
  return __return_storage_ptr__;
}

Assistant:

std::string convertIntoString(StringRef string, bool escape_invisibles) {
        std::string ret;
        // This is enough for the "don't escape invisibles" case, and a good
        // lower bound on the "escape invisibles" case.
        ret.reserve(string.size() + 2);

        if (!escape_invisibles) {
            ret += '"';
            ret += string;
            ret += '"';
            return ret;
        }

        ret += '"';
        for (char c : string) {
            switch (c) {
            case '\r':
                ret.append("\\r");
                break;
            case '\n':
                ret.append("\\n");
                break;
            case '\t':
                ret.append("\\t");
                break;
            case '\f':
                ret.append("\\f");
                break;
            default:
                ret.push_back(c);
                break;
            }
        }
        ret += '"';

        return ret;
    }